

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeStatement(ExpressionContext *ctx,SynBase *syntax)

{
  IntrusiveList<MatchData> matches;
  IntrusiveList<TypeHandle> generics_00;
  SynReturn *source;
  SynBase *ctx_00;
  bool bVar1;
  SynFunctionDefinition *syntax_00;
  SynClassPrototype *syntax_01;
  SynEnumDefinition *syntax_02;
  SynNamespaceDefinition *syntax_03;
  SynTypedef *syntax_04;
  SynIfElse *syntax_05;
  SynFor *syntax_06;
  SynForEach *syntax_07;
  SynWhile *syntax_08;
  SynDoWhile *syntax_09;
  SynSwitch *syntax_10;
  SynBreak *syntax_11;
  SynContinue *syntax_12;
  SynBlock *syntax_13;
  ExpressionContext *expr;
  ExpressionContext *this;
  TypeBase *type;
  ExprBase *expression;
  SynBlock *node_17;
  SynContinue *node_16;
  SynBreak *node_15;
  SynSwitch *node_14;
  SynDoWhile *node_13;
  SynWhile *node_12;
  SynForEach *node_11;
  SynFor *node_10;
  SynIfElse *node_9;
  SynTypedef *node_8;
  SynNamespaceDefinition *node_7;
  SynEnumDefinition *node_6;
  SynClassPrototype *node_5;
  undefined1 local_68 [8];
  IntrusiveList<TypeHandle> generics;
  SynClassDefinition *node_4;
  MatchData *local_48;
  SynFunctionDefinition *local_40;
  SynFunctionDefinition *node_3;
  SynVariableDefinitions *node_2;
  SynYield *node_1;
  SynReturn *node;
  SynBase *syntax_local;
  ExpressionContext *ctx_local;
  
  node = (SynReturn *)syntax;
  syntax_local = (SynBase *)ctx;
  node_1 = (SynYield *)getType<SynReturn>(syntax);
  if (node_1 == (SynYield *)0x0) {
    node_2 = (SynVariableDefinitions *)getType<SynYield>(&node->super_SynBase);
    if (node_2 == (SynVariableDefinitions *)0x0) {
      node_3 = (SynFunctionDefinition *)getType<SynVariableDefinitions>(&node->super_SynBase);
      if (node_3 == (SynFunctionDefinition *)0x0) {
        syntax_00 = getType<SynFunctionDefinition>(&node->super_SynBase);
        ctx_00 = syntax_local;
        local_40 = syntax_00;
        if (syntax_00 == (SynFunctionDefinition *)0x0) {
          generics.tail = (TypeHandle *)getType<SynClassDefinition>(&node->super_SynBase);
          if ((SynClassDefinition *)generics.tail == (SynClassDefinition *)0x0) {
            syntax_01 = getType<SynClassPrototype>(&node->super_SynBase);
            if (syntax_01 == (SynClassPrototype *)0x0) {
              syntax_02 = getType<SynEnumDefinition>(&node->super_SynBase);
              if (syntax_02 == (SynEnumDefinition *)0x0) {
                syntax_03 = getType<SynNamespaceDefinition>(&node->super_SynBase);
                if (syntax_03 == (SynNamespaceDefinition *)0x0) {
                  syntax_04 = getType<SynTypedef>(&node->super_SynBase);
                  if (syntax_04 == (SynTypedef *)0x0) {
                    syntax_05 = getType<SynIfElse>(&node->super_SynBase);
                    if (syntax_05 == (SynIfElse *)0x0) {
                      syntax_06 = getType<SynFor>(&node->super_SynBase);
                      if (syntax_06 == (SynFor *)0x0) {
                        syntax_07 = getType<SynForEach>(&node->super_SynBase);
                        if (syntax_07 == (SynForEach *)0x0) {
                          syntax_08 = getType<SynWhile>(&node->super_SynBase);
                          if (syntax_08 == (SynWhile *)0x0) {
                            syntax_09 = getType<SynDoWhile>(&node->super_SynBase);
                            if (syntax_09 == (SynDoWhile *)0x0) {
                              syntax_10 = getType<SynSwitch>(&node->super_SynBase);
                              if (syntax_10 == (SynSwitch *)0x0) {
                                syntax_11 = getType<SynBreak>(&node->super_SynBase);
                                if (syntax_11 == (SynBreak *)0x0) {
                                  syntax_12 = getType<SynContinue>(&node->super_SynBase);
                                  if (syntax_12 == (SynContinue *)0x0) {
                                    syntax_13 = getType<SynBlock>(&node->super_SynBase);
                                    if (syntax_13 == (SynBlock *)0x0) {
                                      expr = (ExpressionContext *)
                                             AnalyzeExpression((ExpressionContext *)syntax_local,
                                                               &node->super_SynBase);
                                      bVar1 = AssertValueExpression
                                                        ((ExpressionContext *)syntax_local,
                                                         &node->super_SynBase,(ExprBase *)expr);
                                      ctx_local = expr;
                                      if (!bVar1) {
                                        this = (ExpressionContext *)
                                               ExpressionContext::get<ExprError>
                                                         ((ExpressionContext *)syntax_local);
                                        source = node;
                                        type = &ExpressionContext::GetErrorType
                                                          ((ExpressionContext *)syntax_local)->
                                                super_TypeBase;
                                        ExprError::ExprError
                                                  ((ExprError *)this,&source->super_SynBase,type,
                                                   (ExprBase *)expr);
                                        ctx_local = this;
                                      }
                                    }
                                    else {
                                      ctx_local = (ExpressionContext *)
                                                  AnalyzeBlock((ExpressionContext *)syntax_local,
                                                               syntax_13,true);
                                    }
                                  }
                                  else {
                                    ctx_local = (ExpressionContext *)
                                                AnalyzeContinue((ExpressionContext *)syntax_local,
                                                                syntax_12);
                                  }
                                }
                                else {
                                  ctx_local = (ExpressionContext *)
                                              AnalyzeBreak((ExpressionContext *)syntax_local,
                                                           syntax_11);
                                }
                              }
                              else {
                                ctx_local = (ExpressionContext *)
                                            AnalyzeSwitch((ExpressionContext *)syntax_local,
                                                          syntax_10);
                              }
                            }
                            else {
                              ctx_local = (ExpressionContext *)
                                          AnalyzeDoWhile((ExpressionContext *)syntax_local,syntax_09
                                                        );
                            }
                          }
                          else {
                            ctx_local = (ExpressionContext *)
                                        AnalyzeWhile((ExpressionContext *)syntax_local,syntax_08);
                          }
                        }
                        else {
                          ctx_local = (ExpressionContext *)
                                      AnalyzeForEach((ExpressionContext *)syntax_local,syntax_07);
                        }
                      }
                      else {
                        ctx_local = (ExpressionContext *)
                                    AnalyzeFor((ExpressionContext *)syntax_local,syntax_06);
                      }
                    }
                    else {
                      ctx_local = (ExpressionContext *)
                                  AnalyzeIfElse((ExpressionContext *)syntax_local,syntax_05);
                    }
                  }
                  else {
                    ctx_local = (ExpressionContext *)
                                AnalyzeTypedef((ExpressionContext *)syntax_local,syntax_04);
                  }
                }
                else {
                  ctx_local = (ExpressionContext *)
                              AnalyzeNamespaceDefinition
                                        ((ExpressionContext *)syntax_local,syntax_03);
                }
              }
              else {
                ctx_local = (ExpressionContext *)
                            AnalyzeEnumDefinition((ExpressionContext *)syntax_local,syntax_02);
              }
            }
            else {
              ctx_local = (ExpressionContext *)
                          AnalyzeClassPrototype((ExpressionContext *)syntax_local,syntax_01);
            }
          }
          else {
            IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)local_68);
            generics_00.tail = generics.head;
            generics_00.head = (TypeHandle *)local_68;
            ctx_local = (ExpressionContext *)
                        AnalyzeClassDefinition
                                  ((ExpressionContext *)syntax_local,
                                   (SynClassDefinition *)generics.tail,(TypeGenericClassProto *)0x0,
                                   generics_00);
          }
        }
        else {
          IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&node_4);
          matches.tail = local_48;
          matches.head = (MatchData *)node_4;
          ctx_local = (ExpressionContext *)
                      AnalyzeFunctionDefinition
                                ((ExpressionContext *)ctx_00,syntax_00,(FunctionData *)0x0,
                                 (TypeFunction *)0x0,(TypeBase *)0x0,matches,true,false,true);
        }
      }
      else {
        ctx_local = (ExpressionContext *)
                    AnalyzeVariableDefinitions
                              ((ExpressionContext *)syntax_local,(SynVariableDefinitions *)node_3);
      }
    }
    else {
      ctx_local = (ExpressionContext *)
                  AnalyzeYield((ExpressionContext *)syntax_local,(SynYield *)node_2);
    }
  }
  else {
    ctx_local = (ExpressionContext *)
                AnalyzeReturn((ExpressionContext *)syntax_local,(SynReturn *)node_1);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeStatement(ExpressionContext &ctx, SynBase *syntax)
{
	if(SynReturn *node = getType<SynReturn>(syntax))
	{
		return AnalyzeReturn(ctx, node);
	}

	if(SynYield *node = getType<SynYield>(syntax))
	{
		return AnalyzeYield(ctx, node);
	}

	if(SynVariableDefinitions *node = getType<SynVariableDefinitions>(syntax))
	{
		return AnalyzeVariableDefinitions(ctx, node);
	}

	if(SynFunctionDefinition *node = getType<SynFunctionDefinition>(syntax))
	{
		return AnalyzeFunctionDefinition(ctx, node, NULL, NULL, NULL, IntrusiveList<MatchData>(), true, false, true);
	}

	if(SynClassDefinition *node = getType<SynClassDefinition>(syntax))
	{
		IntrusiveList<TypeHandle> generics;

		return AnalyzeClassDefinition(ctx, node, NULL, generics);
	}

	if(SynClassPrototype *node = getType<SynClassPrototype>(syntax))
	{
		return AnalyzeClassPrototype(ctx, node);
	}

	if(SynEnumDefinition *node = getType<SynEnumDefinition>(syntax))
	{
		return AnalyzeEnumDefinition(ctx, node);
	}

	if(SynNamespaceDefinition *node = getType<SynNamespaceDefinition>(syntax))
	{
		return AnalyzeNamespaceDefinition(ctx, node);
	}

	if(SynTypedef *node = getType<SynTypedef>(syntax))
	{
		return AnalyzeTypedef(ctx, node);
	}

	if(SynIfElse *node = getType<SynIfElse>(syntax))
	{
		return AnalyzeIfElse(ctx, node);
	}

	if(SynFor *node = getType<SynFor>(syntax))
	{
		return AnalyzeFor(ctx, node);
	}

	if(SynForEach *node = getType<SynForEach>(syntax))
	{
		return AnalyzeForEach(ctx, node);
	}

	if(SynWhile *node = getType<SynWhile>(syntax))
	{
		return AnalyzeWhile(ctx, node);
	}

	if(SynDoWhile *node = getType<SynDoWhile>(syntax))
	{
		return AnalyzeDoWhile(ctx, node);
	}

	if(SynSwitch *node = getType<SynSwitch>(syntax))
	{
		return AnalyzeSwitch(ctx, node);
	}

	if(SynBreak *node = getType<SynBreak>(syntax))
	{
		return AnalyzeBreak(ctx, node);
	}

	if(SynContinue *node = getType<SynContinue>(syntax))
	{
		return AnalyzeContinue(ctx, node);
	}

	if(SynBlock *node = getType<SynBlock>(syntax))
	{
		return AnalyzeBlock(ctx, node, true);
	}

	ExprBase *expression = AnalyzeExpression(ctx, syntax);

	if(!AssertValueExpression(ctx, syntax, expression))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), expression);

	return expression;
}